

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_tcp_socket.c
# Opt level: O3

ssize_t amqp_tcp_socket_send_inner(void *base,void *buf,size_t len,int flags)

{
  int iVar1;
  ssize_t sVar2;
  
  while( true ) {
    while (sVar2 = send(*(int *)((long)base + 8),buf,len,flags | 0x4000), sVar2 < 0) {
      iVar1 = amqp_os_socket_error();
      *(int *)((long)base + 0x20) = iVar1;
      if (iVar1 != 4) {
        return -9;
      }
    }
    len = len - sVar2;
    if (len == 0) break;
    buf = (void *)((long)buf + sVar2);
  }
  *(undefined4 *)((long)base + 0x20) = 0;
  return 0;
}

Assistant:

static ssize_t
amqp_tcp_socket_send_inner(void *base, const void *buf, size_t len, int flags)
{
  struct amqp_tcp_socket_t *self = (struct amqp_tcp_socket_t *)base;
  ssize_t res;

  const char *buf_left = buf;
  ssize_t len_left = len;

#ifdef MSG_NOSIGNAL
  flags |= MSG_NOSIGNAL;
#endif

start:
  res = send(self->sockfd, buf_left, len_left, flags);

  if (res < 0) {
    self->internal_error = amqp_os_socket_error();
    if (EINTR == self->internal_error) {
      goto start;
    } else {
      res = AMQP_STATUS_SOCKET_ERROR;
    }
  } else {
    if (res == len_left) {
      self->internal_error = 0;
      res = AMQP_STATUS_OK;
    } else {
      buf_left += res;
      len_left -= res;
      goto start;
    }
  }

  return res;
}